

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

void duckdb::HistogramBinUpdateFunction<duckdb::HistogramFunctor,float,duckdb::HistogramExact>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *pTVar2;
  idx_t iVar3;
  ulong in_RCX;
  long in_RDI;
  UnifiedVectorFormat *in_R8;
  idx_t bin_entry;
  HistogramBinState<float> *state;
  idx_t idx;
  idx_t i;
  float *data;
  HistogramBinState<float> **states;
  UnifiedVectorFormat input_data;
  bool extra_state;
  Vector *bin_vector;
  UnifiedVectorFormat sdata;
  idx_t in_stack_000000c8;
  idx_t in_stack_000000d0;
  Vector *in_stack_000000d8;
  HistogramBinState<float> *in_stack_000000e0;
  Vector *input;
  UnifiedVectorFormat *in_stack_fffffffffffffec8;
  UnifiedVectorFormat *in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  UnifiedVectorFormat *in_stack_fffffffffffffef0;
  HistogramBinState<float> *this;
  UnifiedVectorFormat *local_f8;
  SelectionVector *local_e0 [9];
  undefined1 local_91;
  long local_90;
  SelectionVector *local_78 [10];
  UnifiedVectorFormat *local_28;
  ulong local_20;
  long local_8;
  float value;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  local_90 = local_8 + 0x68;
  local_91 = HistogramFunctor::CreateExtraState((idx_t)local_28);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_e0);
  HistogramFunctor::PrepareData
            ((Vector *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (idx_t)in_stack_fffffffffffffed8,(bool *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  pTVar2 = (TemplatedValidityMask<unsigned_long> *)
           UnifiedVectorFormat::GetData<duckdb::HistogramBinState<float>*>
                     ((UnifiedVectorFormat *)local_78);
  UnifiedVectorFormat::GetData<float>((UnifiedVectorFormat *)local_e0);
  for (local_f8 = (UnifiedVectorFormat *)0x0; local_f8 < local_28; local_f8 = local_f8 + 1) {
    SelectionVector::get_index(local_e0[0],(idx_t)local_f8);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0);
    if (bVar1) {
      in_stack_fffffffffffffed8 = pTVar2;
      iVar3 = SelectionVector::get_index(local_78[0],(idx_t)local_f8);
      this = (HistogramBinState<float> *)(&in_stack_fffffffffffffed8->validity_mask)[iVar3];
      bVar1 = HistogramBinState<float>::IsSet(this);
      value = (float)((ulong)this >> 0x20);
      if (!bVar1) {
        HistogramBinState<float>::InitializeBins<duckdb::HistogramFunctor>
                  (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,_sdata);
      }
      in_stack_fffffffffffffed0 =
           (UnifiedVectorFormat *)
           HistogramExact::GetBin<float>(value,(unsafe_vector<float> *)in_stack_fffffffffffffef0);
      in_stack_fffffffffffffef0 = in_stack_fffffffffffffed0;
      in_stack_fffffffffffffec8 =
           (UnifiedVectorFormat *)
           vector<unsigned_long,_false>::operator[]
                     ((vector<unsigned_long,_false> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
      *(value_type *)in_stack_fffffffffffffec8 = *(value_type *)in_stack_fffffffffffffec8 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  return;
}

Assistant:

static void HistogramBinUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                       Vector &state_vector, idx_t count) {
	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto &bin_vector = inputs[1];

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);
	auto data = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.IsSet()) {
			state.template InitializeBins<OP>(bin_vector, count, i, aggr_input);
		}
		auto bin_entry = HIST::template GetBin<T>(data[idx], *state.bin_boundaries);
		++(*state.counts)[bin_entry];
	}
}